

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

void Bac_ManSetupTypes(char **pNames,char **pSymbs)

{
  int iVar1;
  Bac_ObjType_t local_1c;
  int Id;
  int Type;
  char **pSymbs_local;
  char **pNames_local;
  
  for (local_1c = BAC_OBJ_PI; (int)local_1c < 0x49; local_1c = local_1c + BAC_OBJ_PI) {
    iVar1 = Bac_GetTypeId(local_1c);
    pNames[(int)local_1c] = s_Types[iVar1].pName;
    pSymbs[(int)local_1c] = s_Types[iVar1].pSymb;
  }
  return;
}

Assistant:

void Bac_ManSetupTypes( char ** pNames, char ** pSymbs )
{
    int Type;
    for ( Type = 1; Type < BAC_BOX_UNKNOWN; Type++ )
    {
        int Id = Bac_GetTypeId( (Bac_ObjType_t)Type );
        pNames[Type] = s_Types[Id].pName;
        pSymbs[Type] = s_Types[Id].pSymb;
    }
}